

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write_double<long_double>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  Alignment AVar1;
  wchar_t wVar2;
  CharTraits<char> CVar3;
  uint uVar4;
  CharTraits<char> *pCVar5;
  CharPtr __src;
  uint uVar6;
  CharTraits<char> CVar7;
  size_t __len_1;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  Buffer<char> *pBVar12;
  ulong __n;
  size_t __len;
  ulong __n_00;
  byte code;
  bool bVar13;
  char format [10];
  long local_48;
  ushort uStack_40;
  
  code = spec->type_;
  uVar6 = code - 0x41;
  if (uVar6 < 0x27) {
    if ((0x71UL >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_00122abe;
      goto LAB_001228bd;
    }
    bVar13 = true;
  }
  else {
LAB_00122abe:
    if (code != 0) {
      internal::report_unknown_type(code,"double");
    }
    code = 0x67;
LAB_001228bd:
    bVar13 = false;
  }
  if (0.0 <= (double)value) {
    if ((spec->flags_ & 1) == 0) {
      CVar7 = (CharTraits<char>)0x0;
    }
    else {
      CVar7 = (CharTraits<char>)0x2b;
      if ((spec->flags_ & 2) == 0) {
        CVar7 = (CharTraits<char>)0x20;
      }
    }
  }
  else {
    value = -value;
    CVar7 = (CharTraits<char>)0x2d;
  }
  if (NAN(value)) {
    pcVar11 = " nan";
    if (bVar13) {
      pcVar11 = " NAN";
    }
    pcVar9 = " nan";
    if (bVar13) {
      pcVar9 = " NAN";
    }
    pcVar9 = pcVar9 + 1;
    if (CVar7 != (CharTraits<char>)0x0) {
      pcVar9 = pcVar11;
    }
    uVar10 = (ulong)(CVar7 != (CharTraits<char>)0x0);
LAB_00122958:
    pCVar5 = (CharTraits<char> *)write_str<char>(this,pcVar9,uVar10 + 3,&spec->super_AlignSpec);
    if (CVar7 != (CharTraits<char>)0x0) {
      *pCVar5 = CVar7;
    }
    return;
  }
  local_48 = SUB108(value,0);
  uStack_40 = (ushort)((unkuint10)value >> 0x40);
  if ((~uStack_40 & 0x7fff) == 0 && local_48 == -0x8000000000000000) {
    pcVar11 = " inf";
    if (bVar13) {
      pcVar11 = " INF";
    }
    pcVar9 = " inf";
    if (bVar13) {
      pcVar9 = " INF";
    }
    uVar10 = (ulong)(CVar7 != (CharTraits<char>)0x0);
    pcVar9 = pcVar9 + 1;
    if (CVar7 != (CharTraits<char>)0x0) {
      pcVar9 = pcVar11;
    }
    goto LAB_00122958;
  }
  pBVar12 = this->buffer_;
  sVar8 = pBVar12->size_;
  uVar6 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (CVar7 != (CharTraits<char>)0x0) {
    if (pBVar12->capacity_ < (uVar6 + (uVar6 == 0)) + sVar8) {
      (**pBVar12->_vptr_Buffer)();
    }
    bVar13 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar13) {
      uVar6 = 0;
    }
    sVar8 = sVar8 + 1;
  }
  format[0] = '%';
  if ((spec->flags_ & 8) == 0) {
    pcVar11 = format + 1;
  }
  else {
    pcVar11 = format + 2;
    format[1] = '#';
  }
  AVar1 = (spec->super_AlignSpec).align_;
  if (AVar1 != ALIGN_CENTER) {
    if (AVar1 == ALIGN_LEFT) {
      *pcVar11 = '-';
      pcVar11 = pcVar11 + 1;
    }
    if (uVar6 != 0) {
      *pcVar11 = '*';
      pcVar11 = pcVar11 + 1;
      goto LAB_001229fc;
    }
  }
  uVar6 = 0;
LAB_001229fc:
  if (-1 < spec->precision_) {
    pcVar11[0] = '.';
    pcVar11[1] = '*';
    pcVar11 = pcVar11 + 2;
  }
  *pcVar11 = 'L';
  pcVar11[1] = code;
  pcVar11[2] = '\0';
  wVar2 = (spec->super_AlignSpec).super_WidthSpec.fill_;
LAB_00122a27:
  do {
    pCVar5 = (CharTraits<char> *)(this->buffer_->ptr_ + sVar8);
    uVar4 = internal::CharTraits<char>::format_float<long_double>
                      (pCVar5,(char *)(this->buffer_->capacity_ - sVar8),(size_t)format,
                       (char *)(ulong)uVar6,spec->precision_,(int)this,value);
    if ((int)uVar4 < 0) goto LAB_00122a7c;
    pBVar12 = this->buffer_;
    if (uVar4 + sVar8 < pBVar12->capacity_) {
      if (CVar7 == (CharTraits<char>)0x0) {
        CVar7 = (CharTraits<char>)0x0;
      }
      else {
        AVar1 = (spec->super_AlignSpec).align_;
        if (((AVar1 != ALIGN_RIGHT) && (AVar1 != ALIGN_DEFAULT)) ||
           (CVar3 = SUB41(wVar2,0), *pCVar5 != (CharTraits<char>)0x20)) {
          CVar3 = CVar7;
          CVar7 = (CharTraits<char>)0x0;
        }
        pCVar5[-1] = CVar3;
        uVar4 = uVar4 + 1;
      }
      if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
        uVar6 = (spec->super_AlignSpec).super_WidthSpec.width_;
        if (uVar4 < uVar6) {
          __src = grow_buffer(this,(ulong)uVar6);
          __n = (ulong)uVar4;
          memmove(__src + (uVar6 - uVar4 >> 1),__src,__n);
          uVar6 = (spec->super_AlignSpec).super_WidthSpec.width_;
          uVar10 = uVar6 - __n;
          __n_00 = uVar10 >> 1;
          if (1 < uVar10) {
            memset(__src,wVar2 & 0xff,__n_00);
          }
          if (uVar6 == uVar4) {
            return;
          }
          memset(__src + __n + __n_00,wVar2 & 0xff,uVar10 - __n_00);
          return;
        }
      }
      if ((CVar7 != (CharTraits<char>)0x0) ||
         ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
        for (; *pCVar5 == (CharTraits<char>)0x20; pCVar5 = pCVar5 + 1) {
          *pCVar5 = SUB41(wVar2,0);
        }
        if (CVar7 != (CharTraits<char>)0x0) {
          pCVar5[-1] = CVar7;
        }
      }
      grow_buffer(this,(ulong)uVar4);
      return;
    }
    uVar10 = uVar4 + sVar8 + 1;
  } while (uVar10 <= pBVar12->capacity_);
  goto LAB_00122a90;
LAB_00122a7c:
  pBVar12 = this->buffer_;
  if (pBVar12->capacity_ != 0xffffffffffffffff) {
    uVar10 = pBVar12->capacity_ + 1;
LAB_00122a90:
    (**pBVar12->_vptr_Buffer)(pBVar12,uVar10);
  }
  goto LAB_00122a27;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}